

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::RenderPlatformWindowsDefault(void *platform_render_arg,void *renderer_render_arg)

{
  int iVar1;
  ImGuiViewport *pIVar2;
  _func_void_ImGuiViewport_ptr_void_ptr *p_Var3;
  ImGuiContext *pIVar4;
  long lVar5;
  
  pIVar4 = GImGui;
  if (GImGui != (ImGuiContext *)0x0) {
    if (1 < (GImGui->PlatformIO).Viewports.Size) {
      lVar5 = 1;
      do {
        pIVar2 = (pIVar4->PlatformIO).Viewports.Data[lVar5];
        if ((pIVar2->Flags & 0x400) == 0) {
          p_Var3 = (pIVar4->PlatformIO).Platform_RenderWindow;
          if (p_Var3 != (_func_void_ImGuiViewport_ptr_void_ptr *)0x0) {
            (*p_Var3)(pIVar2,platform_render_arg);
          }
          p_Var3 = (pIVar4->PlatformIO).Renderer_RenderWindow;
          if (p_Var3 != (_func_void_ImGuiViewport_ptr_void_ptr *)0x0) {
            (*p_Var3)(pIVar2,renderer_render_arg);
          }
        }
        lVar5 = lVar5 + 1;
        iVar1 = (pIVar4->PlatformIO).Viewports.Size;
      } while (lVar5 < iVar1);
      if (1 < iVar1) {
        lVar5 = 1;
        do {
          pIVar2 = (pIVar4->PlatformIO).Viewports.Data[lVar5];
          if ((pIVar2->Flags & 0x400) == 0) {
            p_Var3 = (pIVar4->PlatformIO).Platform_SwapBuffers;
            if (p_Var3 != (_func_void_ImGuiViewport_ptr_void_ptr *)0x0) {
              (*p_Var3)(pIVar2,platform_render_arg);
            }
            p_Var3 = (pIVar4->PlatformIO).Renderer_SwapBuffers;
            if (p_Var3 != (_func_void_ImGuiViewport_ptr_void_ptr *)0x0) {
              (*p_Var3)(pIVar2,renderer_render_arg);
            }
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < (pIVar4->PlatformIO).Viewports.Size);
      }
    }
    return;
  }
  __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() or ImGui::SetCurrentContext()?\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                ,0xddc,"ImGuiPlatformIO &ImGui::GetPlatformIO()");
}

Assistant:

ImGuiPlatformIO& ImGui::GetPlatformIO()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() or ImGui::SetCurrentContext()?");
    return GImGui->PlatformIO;
}